

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Group::Fl_Group(Fl_Group *this,int X,int Y,int W,int H,char *l)

{
  char *l_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Group *this_local;
  
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,l);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Group_002eb930;
  Fl_Widget::align(&this->super_Fl_Widget,1);
  this->children_ = 0;
  this->array_ = (Fl_Widget **)0x0;
  this->savedfocus_ = (Fl_Widget *)0x0;
  this->resizable_ = &this->super_Fl_Widget;
  this->sizes_ = (int *)0x0;
  begin(this);
  return;
}

Assistant:

Fl_Group::Fl_Group(int X,int Y,int W,int H,const char *l)
: Fl_Widget(X,Y,W,H,l) {
  align(FL_ALIGN_TOP);
  children_ = 0;
  array_ = 0;
  savedfocus_ = 0;
  resizable_ = this;
  sizes_ = 0; // this is allocated when first resize() is done
  // Subclasses may want to construct child objects as part of their
  // constructor, so make sure they are add()'d to this object.
  // But you must end() the object!
  begin();
}